

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAnneal.c
# Opt level: O0

int ddJumpingAux(DdManager *table,int x,int x_low,int x_high,double temp)

{
  DdNode *pDVar1;
  int iVar2;
  int iVar3;
  int result;
  int initial_size;
  Move *moves;
  Move *move;
  double temp_local;
  int x_high_local;
  int x_low_local;
  int x_local;
  DdManager *table_local;
  
  iVar2 = table->keys - table->isolated;
  _result = (DdNode *)0x0;
  iVar3 = cuddNextLow(table,x);
  if (iVar3 < x_low) {
    iVar3 = cuddNextHigh(table,x);
    if (x_high < iVar3) {
      return 1;
    }
    _result = (DdNode *)ddJumpingDown(table,x,x_high,iVar2);
    if (_result == (DdNode *)0x0) goto LAB_009e72e7;
    iVar2 = siftBackwardProb(table,(Move *)_result,iVar2,temp);
  }
  else {
    iVar3 = cuddNextHigh(table,x);
    if (iVar3 <= x_high) {
      fprintf((FILE *)table->err,"Unexpected condition in ddJumping\n");
      goto LAB_009e72e7;
    }
    _result = (DdNode *)ddJumpingUp(table,x,x_low,iVar2);
    if (_result == (DdNode *)0x0) goto LAB_009e72e7;
    iVar2 = siftBackwardProb(table,(Move *)_result,iVar2,temp);
  }
  if (iVar2 != 0) {
    while (_result != (DdNode *)0x0) {
      pDVar1 = (_result->type).kids.T;
      _result->ref = 0;
      _result->next = table->nextFree;
      table->nextFree = _result;
      _result = pDVar1;
    }
    return 1;
  }
LAB_009e72e7:
  while (_result != (DdNode *)0x0) {
    pDVar1 = (_result->type).kids.T;
    _result->ref = 0;
    _result->next = table->nextFree;
    table->nextFree = _result;
    _result = pDVar1;
  }
  return 0;
}

Assistant:

static int
ddJumpingAux(
  DdManager * table,
  int  x,
  int  x_low,
  int  x_high,
  double  temp)
{
    Move       *move;
    Move       *moves;        /* list of moves */
    int        initial_size;
    int        result;

    initial_size = table->keys - table->isolated;

#ifdef DD_DEBUG
    assert(table->subtables[x].keys > 0);
#endif

    moves = NULL;

    if (cuddNextLow(table,x) < x_low) {
        if (cuddNextHigh(table,x) > x_high) return(1);
        moves = ddJumpingDown(table,x,x_high,initial_size);
        /* after that point x --> x_high unless early termination */
        if (moves == NULL) goto ddJumpingAuxOutOfMem;
        /* move backward and stop at best position or accept uphill move */
        result = siftBackwardProb(table,moves,initial_size,temp);
        if (!result) goto ddJumpingAuxOutOfMem;
    } else if (cuddNextHigh(table,x) > x_high) {
        moves = ddJumpingUp(table,x,x_low,initial_size);
        /* after that point x --> x_low unless early termination */
        if (moves == NULL) goto ddJumpingAuxOutOfMem;
        /* move backward and stop at best position or accept uphill move */
        result = siftBackwardProb(table,moves,initial_size,temp);
        if (!result) goto ddJumpingAuxOutOfMem;
    } else {
        (void) fprintf(table->err,"Unexpected condition in ddJumping\n");
        goto ddJumpingAuxOutOfMem;
    }
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(1);

ddJumpingAuxOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(0);

}